

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O2

char * duckdb::EnumUtil::ToChars<duckdb::ParquetVersion>(ParquetVersion value)

{
  char *pcVar1;
  NotImplementedException *this;
  int iVar2;
  undefined7 in_register_00000039;
  allocator local_59;
  string local_58;
  string local_38;
  
  iVar2 = (int)CONCAT71(in_register_00000039,value);
  if (iVar2 == 1) {
    pcVar1 = "V1";
  }
  else {
    if (iVar2 != 2) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"Enum value: \'%s\' not implemented",&local_59);
      Exception::ConstructMessage<duckdb::ParquetVersion>(&local_38,&local_58,value);
      NotImplementedException::NotImplementedException(this,&local_38);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar1 = "V2";
  }
  return pcVar1;
}

Assistant:

const char *EnumUtil::ToChars<ParquetVersion>(ParquetVersion value) {
	switch (value) {
	case ParquetVersion::V1:
		return "V1";
	case ParquetVersion::V2:
		return "V2";
	default:
		throw NotImplementedException(StringUtil::Format("Enum value: '%s' not implemented", value));
	}
}